

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglTestCase.cpp
# Opt level: O0

void __thiscall
deqp::egl::EglTestContext::initGLFunctions
          (EglTestContext *this,Functions *dst,ApiType apiType,int numExtensions,char **extensions)

{
  FunctionLibrary *library;
  Library *egl;
  undefined1 local_58 [8];
  GLFunctionLoader loader;
  FunctionLibrary *platformLib;
  char **extensions_local;
  int numExtensions_local;
  Functions *dst_local;
  EglTestContext *this_local;
  ApiType apiType_local;
  
  loader.m_library._4_4_ = apiType.m_bits;
  library = eglu::GLLibraryCache::getLibrary(&this->m_glLibraryCache,apiType);
  egl = getLibrary(this);
  eglu::GLFunctionLoader::GLFunctionLoader((GLFunctionLoader *)local_58,egl,library);
  glu::initCoreFunctions(dst,(FunctionLoader *)local_58,apiType);
  glu::initExtensionFunctions(dst,(FunctionLoader *)local_58,apiType,numExtensions,extensions);
  return;
}

Assistant:

void EglTestContext::initGLFunctions (glw::Functions* dst, glu::ApiType apiType, int numExtensions, const char* const* extensions) const
{
	const tcu::FunctionLibrary*		platformLib		= m_glLibraryCache.getLibrary(apiType);
	const eglu::GLFunctionLoader	loader			(getLibrary(), platformLib);

	glu::initCoreFunctions(dst, &loader, apiType);
	glu::initExtensionFunctions(dst, &loader, apiType, numExtensions, extensions);
}